

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall mocker::ir::BuilderContext::emplaceInst<mocker::ir::Ret>(BuilderContext *this)

{
  shared_ptr<mocker::ir::IRInst> local_30;
  undefined1 local_20 [8];
  shared_ptr<mocker::ir::Ret> inst;
  BuilderContext *this_local;
  
  inst.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<mocker::ir::Ret>();
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Ret,void>
            (&local_30,(shared_ptr<mocker::ir::Ret> *)local_20);
  appendInst(this,&local_30);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_30);
  std::shared_ptr<mocker::ir::Ret>::~shared_ptr((shared_ptr<mocker::ir::Ret> *)local_20);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }